

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O0

int __thiscall AActor::GetTeam(AActor *this)

{
  int local_1c;
  int myTeam;
  AActor *this_local;
  
  if (this->player == (player_t *)0x0) {
    local_1c = this->DesignatedTeam;
    if ((local_1c == 0xff) && (this->FriendPlayer != '\0')) {
      local_1c = userinfo_t::GetTeam((userinfo_t *)
                                     ((long)(int)(this->FriendPlayer - 1) * 0x2a0 + 0xd63498));
    }
    this_local._4_4_ = local_1c;
  }
  else {
    this_local._4_4_ = userinfo_t::GetTeam(&this->player->userinfo);
  }
  return this_local._4_4_;
}

Assistant:

int AActor::GetTeam()
{
	if (player)
	{
		return player->userinfo.GetTeam();
	}

	int myTeam = DesignatedTeam;

	// Check for monsters that belong to a player on the team but aren't part of the team themselves.
	if (myTeam == TEAM_NONE && FriendPlayer != 0)
	{
		myTeam = players[FriendPlayer - 1].userinfo.GetTeam();
	}
	return myTeam;

}